

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket_test.cpp
# Opt level: O3

pint p_test_case_psocket_general_tcp_test(void)

{
  int iVar1;
  pboolean pVar2;
  long lVar3;
  long lVar4;
  PSocketAddress *addr1;
  PSocketAddress *addr2;
  pchar sock_buf [10];
  undefined1 local_2a [10];
  
  p_test_module_fail_counter = 0;
  p_libsys_init();
  lVar3 = p_socket_new(2,1,6,0);
  p_socket_set_blocking(lVar3,0);
  p_socket_set_listen_backlog(lVar3,0xb);
  p_socket_set_timeout(lVar3,0xfffffff4);
  iVar1 = p_socket_get_timeout(lVar3);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x38e);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_socket_set_timeout(lVar3,0xc);
  if (lVar3 == 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x391);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_family(lVar3);
  if (iVar1 != 2) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x392);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_fd(lVar3);
  if (iVar1 < 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x393);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_listen_backlog(lVar3);
  if (iVar1 != 0xb) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x394);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_timeout(lVar3);
  if (iVar1 != 0xc) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x395);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar4 = p_socket_get_remote_address(lVar3,0);
  if (lVar4 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x396);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_protocol(lVar3);
  if (iVar1 != 6) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x397);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_blocking(lVar3);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x398);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_type(lVar3);
  if (iVar1 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x399);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_keepalive(lVar3);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x39a);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_is_closed(lVar3);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x39b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_socket_set_keepalive(lVar3,0);
  iVar1 = p_socket_get_keepalive(lVar3);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x39e);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_socket_set_keepalive(lVar3,1);
  p_socket_set_keepalive(lVar3,0);
  iVar1 = p_socket_get_keepalive(lVar3);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3a2);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  addr1 = (PSocketAddress *)p_socket_address_new("127.0.0.1",0);
  if (addr1 == (PSocketAddress *)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3a5);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_bind(lVar3,addr1,1,0);
  if (iVar1 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3a7);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  addr2 = (PSocketAddress *)p_socket_get_local_address(lVar3,0);
  if (addr2 == (PSocketAddress *)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3aa);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  else {
    pVar2 = compare_socket_addresses(addr1,addr2);
    if (pVar2 != 0) goto LAB_0010468d;
  }
  printf("%s:%d: check failed\n",
         "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
         ,0x3ac);
  p_atomic_int_inc(&p_test_module_fail_counter);
LAB_0010468d:
  iVar1 = p_socket_set_buffer_size(lVar3,1,0x12000,0);
  if (iVar1 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3ae);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_set_buffer_size(lVar3,0,0x12000,0);
  if (iVar1 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3af);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_is_connected(lVar3);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3b2);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_check_connect_result(lVar3,0);
  if (iVar1 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3b3);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_close(lVar3,0);
  if (iVar1 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3b4);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_bind(lVar3,addr1,1,0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3b8);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_connect(lVar3,addr2,0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3b9);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_listen(lVar3,0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3ba);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar4 = p_socket_accept(lVar3,0);
  if (lVar4 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3bb);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar4 = p_socket_receive(lVar3,local_2a,10,0);
  if (lVar4 != -1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3bc);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar4 = p_socket_receive_from(lVar3,0,local_2a,10,0);
  if (lVar4 != -1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3bd);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar4 = p_socket_send(lVar3,local_2a,10,0);
  if (lVar4 != -1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3be);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar4 = p_socket_send_to(lVar3,addr2,local_2a,10,0);
  if (lVar4 != -1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3bf);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_shutdown(lVar3,1,1,0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3c0);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar4 = p_socket_get_local_address(lVar3,0);
  if (lVar4 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3c1);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_check_connect_result(lVar3,0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3c2);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_is_closed(lVar3);
  if (iVar1 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3c3);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_fd(lVar3);
  if (iVar1 != -1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3c4);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_socket_set_keepalive(lVar3,1);
  iVar1 = p_socket_get_keepalive(lVar3);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3c7);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_io_condition_wait(lVar3,1,0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3c9);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_io_condition_wait(lVar3,2,0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3ca);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_set_buffer_size(lVar3,1,0x12000,0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3cc);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_set_buffer_size(lVar3,0,0x12000,0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x3cd);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_socket_address_free(addr1);
  p_socket_address_free(addr2);
  p_socket_free(lVar3);
  p_libsys_shutdown();
  return -(uint)(p_test_module_fail_counter != 0);
}

Assistant:

P_TEST_CASE_BEGIN (psocket_general_tcp_test)
{
	p_libsys_init ();

	/* Test TCP socket */
	PSocket *socket = p_socket_new (P_SOCKET_FAMILY_INET,
					P_SOCKET_TYPE_STREAM,
					P_SOCKET_PROTOCOL_TCP,
					NULL);
	p_socket_set_blocking (socket, FALSE);
	p_socket_set_listen_backlog (socket, 11);

	p_socket_set_timeout (socket, -12);
	P_TEST_CHECK (p_socket_get_timeout (socket) == 0);
	p_socket_set_timeout (socket, 12);

	P_TEST_CHECK (socket != NULL);
	P_TEST_CHECK (p_socket_get_family (socket) == P_SOCKET_FAMILY_INET);
	P_TEST_CHECK (p_socket_get_fd (socket) >= 0);
	P_TEST_CHECK (p_socket_get_listen_backlog (socket) == 11);
	P_TEST_CHECK (p_socket_get_timeout (socket) == 12);
	P_TEST_CHECK (p_socket_get_remote_address (socket, NULL) == NULL);
	P_TEST_CHECK (p_socket_get_protocol (socket) == P_SOCKET_PROTOCOL_TCP);
	P_TEST_CHECK (p_socket_get_blocking (socket) == FALSE);
	P_TEST_CHECK (p_socket_get_type (socket) == P_SOCKET_TYPE_STREAM);
	P_TEST_CHECK (p_socket_get_keepalive (socket) == FALSE);
	P_TEST_CHECK (p_socket_is_closed (socket) == FALSE);

	p_socket_set_keepalive (socket, FALSE);
	P_TEST_CHECK (p_socket_get_keepalive (socket) == FALSE);

	p_socket_set_keepalive (socket, TRUE);
	p_socket_set_keepalive (socket, FALSE);
	P_TEST_CHECK (p_socket_get_keepalive (socket) == FALSE);

	PSocketAddress *sock_addr = p_socket_address_new ("127.0.0.1", 0);
	P_TEST_CHECK (sock_addr != NULL);

	P_TEST_CHECK (p_socket_bind (socket, sock_addr, TRUE, NULL) == TRUE);

	PSocketAddress *addr = p_socket_get_local_address (socket, NULL);
	P_TEST_CHECK (addr != NULL);

	P_TEST_CHECK (compare_socket_addresses (sock_addr, addr) == TRUE);

	P_TEST_CHECK (p_socket_set_buffer_size (socket, P_SOCKET_DIRECTION_RCV, 72 * 1024, NULL) == TRUE);
	P_TEST_CHECK (p_socket_set_buffer_size (socket, P_SOCKET_DIRECTION_SND, 72 * 1024, NULL) == TRUE);

	/* In case of success p_socket_check_connect_result() marks socket as connected */
	P_TEST_CHECK (p_socket_is_connected (socket) == FALSE);
	P_TEST_CHECK (p_socket_check_connect_result (socket, NULL) == TRUE);
	P_TEST_CHECK (p_socket_close (socket, NULL) == TRUE);

	pchar sock_buf[10];

	P_TEST_CHECK (p_socket_bind (socket, sock_addr, TRUE, NULL) == FALSE);
	P_TEST_CHECK (p_socket_connect (socket, addr, NULL) == FALSE);
	P_TEST_CHECK (p_socket_listen (socket, NULL) == FALSE);
	P_TEST_CHECK (p_socket_accept (socket, NULL) == FALSE);
	P_TEST_CHECK (p_socket_receive (socket, sock_buf, sizeof (sock_buf), NULL) == -1);
	P_TEST_CHECK (p_socket_receive_from (socket, NULL, sock_buf, sizeof (sock_buf), NULL) == -1);
	P_TEST_CHECK (p_socket_send (socket, sock_buf, sizeof (sock_buf), NULL) == -1);
	P_TEST_CHECK (p_socket_send_to (socket, addr, sock_buf, sizeof (sock_buf), NULL) == -1);
	P_TEST_CHECK (p_socket_shutdown (socket, TRUE, TRUE, NULL) == FALSE);
	P_TEST_CHECK (p_socket_get_local_address (socket, NULL) == NULL);
	P_TEST_CHECK (p_socket_check_connect_result (socket, NULL) == FALSE);
	P_TEST_CHECK (p_socket_is_closed (socket) == TRUE);
	P_TEST_CHECK (p_socket_get_fd (socket) == -1);

	p_socket_set_keepalive (socket, TRUE);
	P_TEST_CHECK (p_socket_get_keepalive (socket) == FALSE);

	P_TEST_CHECK (p_socket_io_condition_wait (socket, P_SOCKET_IO_CONDITION_POLLIN, NULL) == FALSE);
	P_TEST_CHECK (p_socket_io_condition_wait (socket, P_SOCKET_IO_CONDITION_POLLOUT, NULL) == FALSE);

	P_TEST_CHECK (p_socket_set_buffer_size (socket, P_SOCKET_DIRECTION_RCV, 72 * 1024, NULL) == FALSE);
	P_TEST_CHECK (p_socket_set_buffer_size (socket, P_SOCKET_DIRECTION_SND, 72 * 1024, NULL) == FALSE);

	p_socket_address_free (sock_addr);
	p_socket_address_free (addr);

	p_socket_free (socket);

	p_libsys_shutdown ();
}